

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O2

RequiredError *
CLI::RequiredError::Subcommand(RequiredError *__return_storage_ptr__,size_t min_subcom)

{
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string local_30;
  
  if (min_subcom == 1) {
    ::std::__cxx11::string::string((string *)&local_50,"A subcommand",(allocator *)&local_90);
    RequiredError(__return_storage_ptr__,&local_50);
    this = &local_50;
  }
  else {
    std::__cxx11::to_string(&local_30,min_subcom);
    ::std::operator+(&local_90,"Requires at least ",&local_30);
    ::std::operator+(&local_70,&local_90," subcommands");
    RequiredError(__return_storage_ptr__,&local_70,RequiredError);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_90);
    this = &local_30;
  }
  ::std::__cxx11::string::~string((string *)this);
  return __return_storage_ptr__;
}

Assistant:

static RequiredError Subcommand(size_t min_subcom) {
        if(min_subcom == 1)
            return RequiredError("A subcommand");
        else
            return RequiredError("Requires at least " + std::to_string(min_subcom) + " subcommands",
                                 ExitCodes::RequiredError);
    }